

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DbCheckPostLower.cpp
# Opt level: O0

void __thiscall DbCheckPostLower::Check(DbCheckPostLower *this)

{
  code *pcVar1;
  bool bVar2;
  BranchInstr **this_00;
  bool bVar3;
  IRKind IVar4;
  bool bVar5;
  IRType IVar6;
  IRType IVar7;
  RegNum RVar8;
  int iVar9;
  int iVar10;
  undefined4 *puVar11;
  LabelInstr *pLVar12;
  Type_conflict node;
  Type *ppBVar13;
  Instr *pIVar14;
  BranchInstr *pBVar15;
  Opnd *pOVar16;
  AddrOpnd *pAVar17;
  Opnd *pOVar18;
  RegOpnd *this_01;
  bool bVar19;
  bool local_129;
  bool local_119;
  bool local_10a;
  byte local_109;
  bool local_f9;
  bool local_ea;
  byte local_e9;
  byte local_c1;
  Instr *local_c0;
  Instr *instrPrev_1;
  Instr *instrNextDebug;
  LabelInstr *targetLabel;
  Instr *prevInstr;
  LabelInstr *nextLabel;
  Instr *instrPrev;
  BranchInstr **branchInstr;
  Iterator __iter;
  LabelInstr *labelInstr;
  bool isDeadLabel;
  Instr *pIStack_68;
  bool foundNonHelperPath;
  Instr *instr;
  Instr *instrStop;
  Instr *instrNext;
  bool isInHelperBlock;
  bool doOpHelperCheck;
  DbCheckPostLower *this_local;
  
  local_c1 = 0;
  if ((DAT_01e9e318 & 1) != 0) {
    local_c1 = (byte)((uint)*(undefined4 *)&this->func->field_0x240 >> 0x18) & 1 ^ 0xff;
  }
  bVar19 = false;
  pIStack_68 = this->func->m_headInstr;
  do {
    if (pIStack_68 == (Instr *)0x0) {
      return;
    }
    instrStop = pIStack_68->m_next;
    bVar3 = Lowerer::ValidOpcodeAfterLower(pIStack_68,this->func);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                         ,0x11,"(Lowerer::ValidOpcodeAfterLower(instr, this->func))",
                         "Lowerer::ValidOpcodeAfterLower(instr, this->func)");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    LowererMD::Legalize<true>(pIStack_68,false);
    IVar4 = IR::Instr::GetKind(pIStack_68);
    if (IVar4 == InstrKindBranch) {
      if (((local_c1 & 1) != 0) && (!bVar19)) {
        pBVar15 = IR::Instr::AsBranchInstr(pIStack_68);
        pLVar12 = IR::BranchInstr::GetTarget(pBVar15);
        pBVar15 = IR::Instr::AsBranchInstr(pIStack_68);
        bVar3 = IR::BranchInstr::IsConditional(pBVar15);
        if (bVar3) {
          if ((((byte)pLVar12->field_0x78 >> 1 & 1) != 0) &&
             (((byte)pLVar12->field_0x78 >> 5 & 1) == 0)) {
            pIVar14 = IR::Instr::GetNextRealInstrOrLabel(pIStack_68);
            IVar4 = IR::Instr::GetKind(pIVar14);
            local_129 = true;
            if (IVar4 != InstrKindLabel) {
              local_129 = IR::Instr::IsProfiledLabelInstr(pIVar14);
            }
            if ((local_129 != false) &&
               (pLVar12 = IR::Instr::AsLabelInstr(pIVar14),
               ((byte)pLVar12->field_0x78 >> 1 & 1) != 0)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar11 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                                 ,0x62,
                                 "(!(instrNextDebug->IsLabelInstr() && instrNextDebug->AsLabelInstr()->isOpHelper))"
                                 ,
                                 "!(instrNextDebug->IsLabelInstr() && instrNextDebug->AsLabelInstr()->isOpHelper)"
                                );
              if (!bVar3) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar11 = 0;
            }
          }
        }
        else {
          pBVar15 = IR::Instr::AsBranchInstr(pIStack_68);
          bVar3 = IR::BranchInstr::IsUnconditional(pBVar15);
          if (!bVar3) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                               ,0x67,"(instr->AsBranchInstr()->IsUnconditional())",
                               "instr->AsBranchInstr()->IsUnconditional()");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 0;
          }
          if (pLVar12 == (LabelInstr *)0x0) {
            pOVar16 = IR::Instr::GetSrc1(pIStack_68);
            if (pOVar16 == (Opnd *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar11 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                                 ,0x86,"(instr->GetSrc1())","instr->GetSrc1()");
              if (!bVar3) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar11 = 0;
            }
          }
          else if ((((byte)pLVar12->field_0x78 >> 1 & 1) != 0) &&
                  (((byte)pLVar12->field_0x78 >> 5 & 1) == 0)) {
            local_c0 = pIStack_68->m_prev;
            if ((*(uint *)&this->func->field_0x240 >> 0x16 & 1) != 0) {
              while (bVar3 = LowererMD::IsAssign(local_c0), bVar3) {
                local_c0 = local_c0->m_prev;
              }
            }
            if (local_c0->m_opcode != DeletedNonHelperBranch) {
              bVar3 = IR::Instr::IsBranchInstr(local_c0);
              if (bVar3) {
                pBVar15 = IR::Instr::AsBranchInstr(local_c0);
                bVar3 = IR::BranchInstr::IsConditional(pBVar15);
                if (bVar3) {
                  pBVar15 = IR::Instr::AsBranchInstr(local_c0);
                  pLVar12 = IR::BranchInstr::GetTarget(pBVar15);
                  if (((byte)pLVar12->field_0x78 >> 1 & 1) != 0) {
                    pBVar15 = IR::Instr::AsBranchInstr(local_c0);
                    pLVar12 = IR::BranchInstr::GetTarget(pBVar15);
                    if (((byte)pLVar12->field_0x78 >> 5 & 1) == 0) goto LAB_00512b3b;
                  }
                  goto LAB_0051320e;
                }
              }
LAB_00512b3b:
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar11 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                                 ,0x82,
                                 "((instrPrev->IsBranchInstr() && instrPrev->AsBranchInstr()->IsConditional() && (!instrPrev->AsBranchInstr()->GetTarget()->isOpHelper || instrPrev->AsBranchInstr()->GetTarget()->m_noHelperAssert)))"
                                 ,
                                 "(instrPrev->IsBranchInstr() && instrPrev->AsBranchInstr()->IsConditional() && (!instrPrev->AsBranchInstr()->GetTarget()->isOpHelper || instrPrev->AsBranchInstr()->GetTarget()->m_noHelperAssert))"
                                );
              if (!bVar3) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar11 = 0;
            }
          }
        }
      }
    }
    else if ((IVar4 == InstrKindLabel) || (IVar4 == InstrKindProfiledLabel)) {
      pLVar12 = IR::Instr::AsLabelInstr(pIStack_68);
      bVar19 = ((byte)pLVar12->field_0x78 >> 1 & 1) != 0;
      if ((((local_c1 & 1) != 0) && (!bVar19)) &&
         (pLVar12 = IR::Instr::AsLabelInstr(pIStack_68), ((byte)pLVar12->field_0x78 >> 5 & 1) == 0))
      {
        bVar3 = false;
        bVar2 = true;
        pLVar12 = IR::Instr::AsLabelInstr(pIStack_68);
        do {
          __iter.current = (NodeBase *)pLVar12;
          _branchInstr = SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>::
                         GetIterator((SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>
                                      *)(__iter.current + 0xb));
          do {
            if (__iter.list ==
                (SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar11 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                 ,0x76,"(current != nullptr)","current != nullptr");
              if (!bVar5) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar11 = 0;
            }
            this_00 = branchInstr;
            node = SListNodeBase<Memory::ArenaAllocator>::Next
                             (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
            bVar5 = SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                              ((SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount> *)
                               this_00,node);
            if (bVar5) goto LAB_00512529;
            SListNodeBase<Memory::ArenaAllocator>::Next
                      (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
            ppBVar13 = SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>::Iterator::
                       Data((Iterator *)&branchInstr);
            bVar2 = false;
            nextLabel = (LabelInstr *)((*ppBVar13)->super_Instr).m_prev;
            while( true ) {
              local_e9 = 0;
              if (nextLabel != (LabelInstr *)0x0) {
                IVar4 = IR::Instr::GetKind(&nextLabel->super_Instr);
                local_ea = true;
                if (IVar4 != InstrKindLabel) {
                  local_ea = IR::Instr::IsProfiledLabelInstr(&nextLabel->super_Instr);
                }
                local_e9 = local_ea ^ 0xff;
              }
              if ((local_e9 & 1) == 0) break;
              nextLabel = (LabelInstr *)(nextLabel->super_Instr).m_prev;
            }
          } while (((nextLabel != (LabelInstr *)0x0) &&
                   (pLVar12 = IR::Instr::AsLabelInstr(&nextLabel->super_Instr),
                   ((byte)pLVar12->field_0x78 >> 1 & 1) != 0)) &&
                  (((*ppBVar13)->m_isHelperToNonHelperBranch & 1U) == 0));
          bVar3 = true;
LAB_00512529:
          pIVar14 = (Instr *)__iter.current[2].next;
          IVar4 = IR::Instr::GetKind(pIVar14);
          local_f9 = true;
          if (IVar4 != InstrKindLabel) {
            local_f9 = IR::Instr::IsProfiledLabelInstr(pIVar14);
          }
          if (local_f9 == false) break;
          pLVar12 = IR::Instr::AsLabelInstr((Instr *)__iter.current[2].next);
          if ((((*(uint *)&this->func->field_0x240 >> 0x17 & 1) == 0) &&
              (((byte)pLVar12->field_0x78 >> 5 & 1) == 0)) &&
             (((byte)pLVar12->field_0x78 >> 1 & 1) != 0)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                               ,0x3a,
                               "(func->isPostPeeps || nextLabel->m_noHelperAssert || !nextLabel->isOpHelper)"
                               ,
                               "func->isPostPeeps || nextLabel->m_noHelperAssert || !nextLabel->isOpHelper"
                              );
            if (!bVar5) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 0;
          }
        } while (((byte)pLVar12->field_0x78 >> 1 & 1) == 0);
        instrStop = (Instr *)__iter.current[2].next;
        if (!bVar3) {
          pIVar14 = IR::Instr::GetNextRealInstrOrLabel(pIStack_68);
          bVar3 = IR::Instr::IsExitInstr(pIVar14);
          if ((!bVar3) && (!bVar2)) {
            targetLabel = (LabelInstr *)IR::Instr::GetPrevRealInstrOrLabel((Instr *)__iter.current);
            bVar3 = IR::Instr::HasFallThrough((Instr *)targetLabel);
            if ((bVar3) &&
               ((bVar3 = IR::Instr::IsBranchInstr((Instr *)targetLabel), !bVar3 ||
                (pBVar15 = IR::Instr::AsBranchInstr((Instr *)targetLabel),
                (pBVar15->m_isHelperToNonHelperBranch & 1U) == 0)))) {
              while( true ) {
                local_109 = 0;
                if (targetLabel != (LabelInstr *)0x0) {
                  IVar4 = IR::Instr::GetKind(&targetLabel->super_Instr);
                  local_10a = true;
                  if (IVar4 != InstrKindLabel) {
                    local_10a = IR::Instr::IsProfiledLabelInstr(&targetLabel->super_Instr);
                  }
                  local_109 = local_10a ^ 0xff;
                }
                if ((local_109 & 1) == 0) break;
                targetLabel = (LabelInstr *)(targetLabel->super_Instr).m_prev;
              }
              if (targetLabel != (LabelInstr *)0x0) {
                IVar4 = IR::Instr::GetKind(&targetLabel->super_Instr);
                local_119 = true;
                if (IVar4 != InstrKindLabel) {
                  local_119 = IR::Instr::IsProfiledLabelInstr(&targetLabel->super_Instr);
                }
                if ((local_119 != false) &&
                   (pLVar12 = IR::Instr::AsLabelInstr(&targetLabel->super_Instr),
                   ((byte)pLVar12->field_0x78 >> 1 & 1) == 0)) goto LAB_0051320e;
              }
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar11 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                                 ,0x51,
                                 "(prevInstr && prevInstr->IsLabelInstr() && !prevInstr->AsLabelInstr()->isOpHelper)"
                                 ,"Inconsistency in Helper label annotations");
              if (!bVar3) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar11 = 0;
            }
          }
        }
      }
    }
    else {
      pOVar16 = IR::Instr::GetDst(pIStack_68);
      Check(this,pOVar16);
      pOVar16 = IR::Instr::GetSrc1(pIStack_68);
      Check(this,pOVar16);
      pOVar16 = IR::Instr::GetSrc2(pIStack_68);
      Check(this,pOVar16);
      bVar3 = EncoderMD::IsOPEQ(pIStack_68);
      if (bVar3) {
        pOVar16 = IR::Instr::GetDst(pIStack_68);
        pOVar18 = IR::Instr::GetSrc1(pIStack_68);
        bVar3 = IR::Opnd::IsEqual(pOVar16,pOVar18);
        if (!bVar3) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                             ,0x97,"(instr->GetDst()->IsEqual(instr->GetSrc1()))",
                             "instr->GetDst()->IsEqual(instr->GetSrc1())");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 0;
        }
        pOVar16 = IR::Instr::GetSrc2(pIStack_68);
        if (pOVar16 != (Opnd *)0x0) {
          pOVar16 = IR::Instr::GetDst(pIStack_68);
          iVar9 = IR::Opnd::GetSize(pOVar16);
          pOVar16 = IR::Instr::GetSrc2(pIStack_68);
          iVar10 = IR::Opnd::GetSize(pOVar16);
          if (iVar9 != iVar10) {
            bVar3 = EncoderMD::IsSHIFT(pIStack_68);
            if ((((bVar3) || (pIStack_68->m_opcode == BTR)) || (pIStack_68->m_opcode == BTS)) ||
               (pIStack_68->m_opcode == BT)) {
              pOVar16 = IR::Instr::GetSrc2(pIStack_68);
              iVar9 = IR::Opnd::GetSize(pOVar16);
              if (iVar9 == 1) goto LAB_00512e96;
            }
            pOVar16 = IR::Instr::GetSrc2(pIStack_68);
            IVar6 = IR::Opnd::GetType(pOVar16);
            if (IVar6 == TyVar) {
              pOVar16 = IR::Instr::GetDst(pIStack_68);
              iVar9 = IR::Opnd::GetSize(pOVar16);
              if (iVar9 == 4) {
                pOVar16 = IR::Instr::GetSrc2(pIStack_68);
                bVar3 = IR::Opnd::IsAddrOpnd(pOVar16);
                if (bVar3) {
                  pOVar16 = IR::Instr::GetSrc2(pIStack_68);
                  pAVar17 = IR::Opnd::AsAddrOpnd(pOVar16);
                  bVar3 = Math::FitsInDWord((int64)pAVar17->m_address);
                  if (bVar3) goto LAB_00512e96;
                }
              }
            }
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                               ,0xa0,
                               "(!instr->GetSrc2() || instr->GetDst()->GetSize() == instr->GetSrc2()->GetSize() || ((EncoderMD::IsSHIFT(instr) || instr->m_opcode == Js::OpCode::BTR || instr->m_opcode == Js::OpCode::BTS || instr->m_opcode == Js::OpCode::BT) && instr->GetSrc2()->GetSize() == 1) || (instr->GetSrc2()->GetType() == TyVar && instr->GetDst()->GetSize() == 4 && instr->GetSrc2()->IsAddrOpnd() && Math::FitsInDWord(reinterpret_cast<int64>(instr->GetSrc2()->AsAddrOpnd()->m_address))))"
                               ,
                               "!instr->GetSrc2() || instr->GetDst()->GetSize() == instr->GetSrc2()->GetSize() || ((EncoderMD::IsSHIFT(instr) || instr->m_opcode == Js::OpCode::BTR || instr->m_opcode == Js::OpCode::BTS || instr->m_opcode == Js::OpCode::BT) && instr->GetSrc2()->GetSize() == 1) || (instr->GetSrc2()->GetType() == TyVar && instr->GetDst()->GetSize() == 4 && instr->GetSrc2()->IsAddrOpnd() && Math::FitsInDWord(reinterpret_cast<int64>(instr->GetSrc2()->AsAddrOpnd()->m_address)))"
                              );
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 0;
          }
        }
      }
LAB_00512e96:
      bVar3 = LowererMD::IsAssign(pIStack_68);
      if (bVar3) {
        pOVar16 = IR::Instr::GetDst(pIStack_68);
        iVar9 = IR::Opnd::GetSize(pOVar16);
        pOVar16 = IR::Instr::GetSrc1(pIStack_68);
        iVar10 = IR::Opnd::GetSize(pOVar16);
        if (iVar9 != iVar10) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                             ,0xa7,
                             "(!LowererMD::IsAssign(instr) || instr->GetDst()->GetSize() == instr->GetSrc1()->GetSize())"
                             ,
                             "!LowererMD::IsAssign(instr) || instr->GetDst()->GetSize() == instr->GetSrc1()->GetSize()"
                            );
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 0;
        }
      }
      if (pIStack_68->m_opcode == CMP) {
        pOVar16 = IR::Instr::GetSrc1(pIStack_68);
        IVar6 = IR::Opnd::GetType(pOVar16);
        pOVar16 = IR::Instr::GetSrc1(pIStack_68);
        IVar7 = IR::Opnd::GetType(pOVar16);
        if (IVar6 != IVar7) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                             ,0xa8,
                             "(instr->m_opcode != Js::OpCode::CMP || instr->GetSrc1()->GetType() == instr->GetSrc1()->GetType())"
                             ,
                             "instr->m_opcode != Js::OpCode::CMP || instr->GetSrc1()->GetType() == instr->GetSrc1()->GetType()"
                            );
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 0;
        }
      }
      if (pIStack_68->m_opcode == CALL) {
        bVar3 = Func::IsTrueLeaf(pIStack_68->m_func);
        if (bVar3) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                             ,0xc9,"(!instr->m_func->IsTrueLeaf())","!instr->m_func->IsTrueLeaf()");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 0;
        }
      }
      else if ((ushort)(pIStack_68->m_opcode - CMOVA) < 0x10) {
        pOVar16 = IR::Instr::GetSrc2(pIStack_68);
        if (pOVar16 == (Opnd *)0x0) {
          pOVar16 = IR::Instr::GetDst(pIStack_68);
          this_01 = IR::Opnd::AsRegOpnd(pOVar16);
          RVar8 = IR::RegOpnd::GetReg(this_01);
          if (RVar8 == RegNOREG) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                               ,0xc5,"(instr->GetDst()->AsRegOpnd()->GetReg() != RegNOREG)",
                               "instr->GetDst()->AsRegOpnd()->GetReg() != RegNOREG");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 0;
          }
        }
        else {
          pOVar16 = IR::Instr::GetDst(pIStack_68);
          pOVar18 = IR::Instr::GetSrc1(pIStack_68);
          bVar3 = IR::Opnd::IsEqual(pOVar16,pOVar18);
          if (!bVar3) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                               ,0xc0,"(instr->GetDst()->IsEqual(instr->GetSrc1()))",
                               "instr->GetDst()->IsEqual(instr->GetSrc1())");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 0;
          }
        }
      }
    }
LAB_0051320e:
    pIStack_68 = instrStop;
  } while( true );
}

Assistant:

void
DbCheckPostLower::Check()
{
    bool doOpHelperCheck = Js::Configuration::Global.flags.CheckOpHelpers && !this->func->isPostLayout;
    bool isInHelperBlock = false;

    FOREACH_INSTR_IN_FUNC_EDITING(instr, instrNext, this->func)
    {
        Assert(Lowerer::ValidOpcodeAfterLower(instr, this->func));
        LowererMD::Legalize</*verify*/true>(instr);
        switch(instr->GetKind())
        {
        case IR::InstrKindLabel:
        case IR::InstrKindProfiledLabel:
        {
            isInHelperBlock = instr->AsLabelInstr()->isOpHelper;
            if (doOpHelperCheck && !isInHelperBlock && !instr->AsLabelInstr()->m_noHelperAssert)
            {
                bool foundNonHelperPath = false;
                bool isDeadLabel = true;

                IR::LabelInstr* labelInstr = instr->AsLabelInstr();

                while (1)
                {
                    FOREACH_SLIST_ENTRY(IR::BranchInstr *, branchInstr, &labelInstr->labelRefs)
                    {
                        isDeadLabel = false;
                        IR::Instr *instrPrev = branchInstr->m_prev;
                        while (instrPrev && !instrPrev->IsLabelInstr())
                        {
                            instrPrev = instrPrev->m_prev;
                        }
                        if (!instrPrev || !instrPrev->AsLabelInstr()->isOpHelper || branchInstr->m_isHelperToNonHelperBranch)
                        {
                            foundNonHelperPath = true;
                            break;
                        }
                    } NEXT_SLIST_ENTRY;

                    if (!labelInstr->m_next->IsLabelInstr())
                    {
                        break;
                    }
                    IR::LabelInstr *const nextLabel = labelInstr->m_next->AsLabelInstr();

                    // It is generally not expected for a non-helper label to be immediately followed by a helper label. Some
                    // special cases may flag the helper label with m_noHelperAssert = true. Peeps can cause non-helper blocks
                    // to fall through into helper blocks, so skip this check after peeps.
                    Assert(func->isPostPeeps || nextLabel->m_noHelperAssert || !nextLabel->isOpHelper);

                    if(nextLabel->isOpHelper)
                    {
                        break;
                    }
                    labelInstr = nextLabel;
                }

                instrNext = labelInstr->m_next;

                // This label is unreachable or at least one path to it is not from a helper block.

                if (!foundNonHelperPath && !instr->GetNextRealInstrOrLabel()->IsExitInstr() && !isDeadLabel)
                {
                    IR::Instr *prevInstr = labelInstr->GetPrevRealInstrOrLabel();
                    if (prevInstr->HasFallThrough() && !(prevInstr->IsBranchInstr() && prevInstr->AsBranchInstr()->m_isHelperToNonHelperBranch))
                    {
                        while (prevInstr && !prevInstr->IsLabelInstr())
                        {
                            prevInstr = prevInstr->m_prev;
                        }

                        AssertMsg(prevInstr && prevInstr->IsLabelInstr() && !prevInstr->AsLabelInstr()->isOpHelper, "Inconsistency in Helper label annotations");
                    }
                }
            }
            break;
        }
        case IR::InstrKindBranch:
            if (doOpHelperCheck && !isInHelperBlock)
            {
                IR::LabelInstr *targetLabel = instr->AsBranchInstr()->GetTarget();

                // This branch needs a path to a non-helper block.
                if (instr->AsBranchInstr()->IsConditional())
                {
                    if (targetLabel->isOpHelper && !targetLabel->m_noHelperAssert)
                    {
                        IR::Instr *instrNextDebug = instr->GetNextRealInstrOrLabel();
                        Assert(!(instrNextDebug->IsLabelInstr() && instrNextDebug->AsLabelInstr()->isOpHelper));
                    }
                }
                else
                {
                    Assert(instr->AsBranchInstr()->IsUnconditional());

                    if (targetLabel)
                    {
                        if (!targetLabel->isOpHelper || targetLabel->m_noHelperAssert)
                        {
                            break;
                        }
                        // Target is opHelper

                        IR::Instr *instrPrev = instr->m_prev;

                        if (this->func->isPostRegAlloc)
                        {
                            while (LowererMD::IsAssign(instrPrev))
                            {
                                // Skip potential register allocation compensation code
                                instrPrev = instrPrev->m_prev;
                            }
                        }

                        if (instrPrev->m_opcode == Js::OpCode::DeletedNonHelperBranch)
                        {
                            break;
                        }

                        Assert((instrPrev->IsBranchInstr() && instrPrev->AsBranchInstr()->IsConditional()
                            && (!instrPrev->AsBranchInstr()->GetTarget()->isOpHelper || instrPrev->AsBranchInstr()->GetTarget()->m_noHelperAssert)));
                    }
                    else
                    {
                        Assert(instr->GetSrc1());
                    }
                }
            }
            break;

        default:
            this->Check(instr->GetDst());
            this->Check(instr->GetSrc1());
            this->Check(instr->GetSrc2());

#if defined(_M_IX86) || defined(_M_X64)
            // for op-eq's and assignment operators, make  sure the types match
            // for shift operators make sure the types match and the third is an 8-bit immediate
            // for cmp operators similarly check types are same
            if (EncoderMD::IsOPEQ(instr))
            {
                Assert(instr->GetDst()->IsEqual(instr->GetSrc1()));

#if defined(_M_X64)
                Assert(!instr->GetSrc2() || instr->GetDst()->GetSize() == instr->GetSrc2()->GetSize() ||
                    ((EncoderMD::IsSHIFT(instr) || instr->m_opcode == Js::OpCode::BTR ||
                        instr->m_opcode == Js::OpCode::BTS ||
                        instr->m_opcode == Js::OpCode::BT) && instr->GetSrc2()->GetSize() == 1) ||
                    // Is src2 is TyVar and src1 is TyInt32/TyUint32, make sure the address fits in 32 bits 
                        (instr->GetSrc2()->GetType() == TyVar && instr->GetDst()->GetSize() == 4 &&
                         instr->GetSrc2()->IsAddrOpnd() && Math::FitsInDWord(reinterpret_cast<int64>(instr->GetSrc2()->AsAddrOpnd()->m_address))));
#else
                Assert(!instr->GetSrc2() || instr->GetDst()->GetSize() == instr->GetSrc2()->GetSize() ||
                    ((EncoderMD::IsSHIFT(instr) || instr->m_opcode == Js::OpCode::BTR ||
                        instr->m_opcode == Js::OpCode::BT) && instr->GetSrc2()->GetSize() == 1));
#endif
            }
            Assert(!LowererMD::IsAssign(instr) || instr->GetDst()->GetSize() == instr->GetSrc1()->GetSize());
            Assert(instr->m_opcode != Js::OpCode::CMP || instr->GetSrc1()->GetType() == instr->GetSrc1()->GetType());

            switch (instr->m_opcode)
            {
            case Js::OpCode::CMOVA:
            case Js::OpCode::CMOVAE:
            case Js::OpCode::CMOVB:
            case Js::OpCode::CMOVBE:
            case Js::OpCode::CMOVE:
            case Js::OpCode::CMOVG:
            case Js::OpCode::CMOVGE:
            case Js::OpCode::CMOVL:
            case Js::OpCode::CMOVLE:
            case Js::OpCode::CMOVNE:
            case Js::OpCode::CMOVNO:
            case Js::OpCode::CMOVNP:
            case Js::OpCode::CMOVNS:
            case Js::OpCode::CMOVO:
            case Js::OpCode::CMOVP:
            case Js::OpCode::CMOVS:
                if (instr->GetSrc2())
                {
                    // CMOV inserted before regAlloc need a fake use of the dst register to make up for the
                    // fact that the CMOV may not set the dst. Regalloc needs to assign the same physical register for dst and src1.
                    Assert(instr->GetDst()->IsEqual(instr->GetSrc1()));
                }
                else
                {
                    // These must have been inserted post-regalloc.
                    Assert(instr->GetDst()->AsRegOpnd()->GetReg() != RegNOREG);
                }
                break;
            case Js::OpCode::CALL:
                Assert(!instr->m_func->IsTrueLeaf());
                break;
            }
#endif
        }
    } NEXT_INSTR_IN_FUNC_EDITING;
}